

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

int eatcorpse(obj *otmp)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  boolean bVar5;
  unsigned_short uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  bool bVar18;
  char buf [256];
  char local_138 [264];
  
  uVar12 = otmp->corpsenm;
  lVar17 = (long)(int)uVar12;
  uVar2 = mons[lVar17].geno;
  if (lVar17 == 0xc) {
    if (u.uprops[8].extrinsic == 0) {
LAB_00190bbd:
      if (((byte)youmonst.mintrinsics & 0x80) == 0) {
        bVar5 = poly_when_stoned(youmonst.data);
        bVar18 = bVar5 == '\0';
        goto LAB_00190bdd;
      }
    }
    bVar18 = false;
  }
  else {
    bVar18 = false;
    if ((uVar12 == 0xb) && (u.uprops[8].extrinsic == 0)) goto LAB_00190bbd;
  }
LAB_00190bdd:
  bVar1 = mons[lVar17].mlet;
  uVar15 = 7;
  if (bVar1 < 0x1f) {
    if (bVar1 < 0x16) {
      if ((bVar1 == 2) || (bVar1 == 10)) {
LAB_00190c6e:
        uVar15 = 5;
      }
    }
    else if ((bVar1 == 0x16) || (bVar1 == 0x19)) goto LAB_00190c6e;
  }
  else if (bVar1 < 0x2a) {
    if (bVar1 == 0x1f) {
      if (uVar12 != 0x9e) goto LAB_00190c6e;
    }
    else if (bVar1 == 0x20) goto LAB_00190c6e;
  }
  else if (bVar1 == 0x2a) {
    uVar15 = uVar12 == 0xd6 | 6;
  }
  else {
    if (bVar1 == 0x36) goto LAB_00190c6e;
    if (bVar1 == 0x37) {
      uVar15 = (uint)((uVar12 & 0xfffffffd) == 0x104) * 2 + 5;
    }
  }
  uVar2 = uVar2 >> 0xc;
  violated(uVar15);
  lVar9 = 0;
  if ((uVar12 != 0xa3) && (uVar12 != 0x154)) {
    lVar9 = peek_at_iced_corpse_age(otmp);
    uVar14 = (ulong)moves;
    uVar15 = mt_random();
    lVar9 = (long)(uVar14 - lVar9) / (long)(ulong)(uVar15 % 0x14 + 10);
    if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
      if ((*(uint *)&otmp->field_0x4a & 2) != 0) {
        lVar9 = lVar9 + -2;
      }
    }
    else {
      lVar9 = lVar9 + 2;
    }
  }
  uVar15 = (uint)bVar1;
  if (((youmonst.data)->mlet == '0') ||
     (youmonst.data == mons + 0x85 || ((youmonst.data)->mflags2 & 0x100) != 0)) {
    if ((otmp->field_0x4d & 8) == 0) {
      if (otmp->oeaten < (uint)mons[otmp->corpsenm].cnutrit) {
LAB_00190d7a:
        pcVar16 = "There is no blood left in this corpse!";
        goto LAB_00190d81;
      }
    }
    else if (otmp->oeaten <= (uint)((ulong)mons[otmp->corpsenm].cnutrit * 0xccccccd0 >> 0x20))
    goto LAB_00190d7a;
    if ((0 < lVar9) || (lVar10 = peek_at_iced_corpse_age(otmp), lVar10 + 5 < (long)(ulong)moves)) {
      pcVar16 = "The blood in this corpse has coagulated!";
LAB_00190d81:
      pline(pcVar16);
      return 3;
    }
    if (((uVar2 & 1) == 0) ||
       (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
        ((u.umonnum == u.umonster || (bVar5 = dmgtype(youmonst.data,0x24), bVar5 == '\0')))))) {
      pcVar16 = corpse_xname(otmp,'\x01');
      pcVar16 = the(pcVar16);
      strcpy(local_138,pcVar16);
    }
    else {
      pcVar16 = "";
      if ((mons[lVar17].mflags2 & 0x80000) == 0) {
        pcVar16 = "the ";
      }
      pcVar11 = s_suffix(mons[lVar17].mname);
      sprintf(local_138,"%s%s corpse",pcVar16,pcVar11);
    }
    pline("You drain the blood from %s.");
    otmp->field_0x4d = otmp->field_0x4d | 8;
    bVar4 = true;
  }
  else {
    otmp->field_0x4d = otmp->field_0x4d & 0xf7;
    bVar4 = lVar9 < 6;
    if ((uVar12 != 8 && !bVar18) && (5 < lVar9)) {
      bVar5 = maybe_cannibal(uVar12,'\0');
      if (bVar1 < 0x1f) {
        if (uVar15 == 0x15 || bVar1 < 0x15) {
          if ((bVar1 != 2) && (bVar1 != 10)) goto LAB_00191111;
        }
        else if ((uVar15 != 0x16) && (bVar1 != 0x19)) goto LAB_00191111;
LAB_0019132e:
        pcVar16 = "protoplasm";
      }
      else {
        if (bVar1 < 0x36) {
          if (uVar15 == 0x1f) {
            if (uVar12 != 0x9e) goto LAB_0019132e;
          }
          else if (uVar15 == 0x20) {
            pcVar16 = "fungoid vegetation";
            goto LAB_00191335;
          }
        }
        else if ((bVar1 == 0x36) || ((bVar1 == 0x37 && ((uVar12 | 2) != 0x106)))) goto LAB_0019132e;
LAB_00191111:
        pcVar16 = "protoplasm";
        if (bVar1 != 0x2a) {
          pcVar16 = "meat";
        }
        if (uVar12 == 0xd6) {
          pcVar16 = "meat";
        }
      }
LAB_00191335:
      pcVar13 = "";
      pcVar11 = "; you cannibal";
      if (bVar5 == '\0') {
        pcVar11 = "";
      }
      pline("Ulch!  That %s was tainted%s!",pcVar16,pcVar11);
      if (((u.uprops[0x34].intrinsic == 0) &&
          (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
         (bVar5 = defends(0x21,uwep), bVar5 == '\0')) {
        uVar12 = mt_random();
        uVar12 = uVar12 % 10 + 10;
        uVar14 = 1;
        if (u.uprops[0x1d].intrinsic != 1) {
          uVar14 = (ulong)u.uprops[0x1d].intrinsic - 1;
        }
        if (uVar12 <= u.uprops[0x1d].intrinsic) {
          uVar14 = (ulong)uVar12;
        }
        if (u.uprops[0x1d].intrinsic == 0) {
          uVar14 = (ulong)uVar12;
        }
        if ((uVar2 & 1) == 0) {
          pcVar16 = corpse_xname(otmp,'\x01');
          sprintf(local_138,"rotted %s",pcVar16);
        }
        else {
          if ((mons[lVar17].mflags2 & 0x80000) == 0) {
            pcVar13 = "the ";
          }
          pcVar16 = mons_mname(mons + lVar17);
          pcVar16 = s_suffix(pcVar16);
          sprintf(local_138,"%s%s rotted corpse",pcVar13,pcVar16);
        }
        make_sick(uVar14,local_138,'\x01',1);
      }
      else {
        pline("It doesn\'t seem at all sickening, though...");
      }
      if (otmp->where == '\x03') {
        useup(otmp);
      }
      else {
        useupf(otmp,1);
      }
      return 2;
    }
  }
  uVar3 = mons[lVar17].mflags1;
  if ((((uVar3 >> 0x1b & 1) == 0) || (u.uprops[7].extrinsic != 0)) ||
     (((byte)youmonst.mintrinsics & 0x40) != 0)) {
    if (((uVar3 >> 0x1c & 1) == 0) || (uVar7 = mt_random(), uVar7 * -0x33333333 < 0x33333334)) {
      if ((((!bVar4) ||
           ((bVar18 = true, 3 < lVar9 && (uVar7 = mt_random(), 0x33333333 < uVar7 * -0x33333333))))
          && (bVar18 = true, u.uprops[0x34].intrinsic == 0)) &&
         ((bVar18 = true, youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ' &&
          (bVar5 = defends(0x21,uwep), bVar5 == '\0')))) {
        pcVar16 = "very ";
        if (u.uprops[0x1d].intrinsic == 0) {
          pcVar16 = "";
        }
        bVar18 = false;
        pline("You feel %ssick.",pcVar16);
        uVar7 = mt_random();
        losehp((uVar7 & 7) + 1,"cadaver",0);
      }
    }
    else {
      pline("Ecch - that must have been poisonous!");
      if (u.uprops[6].intrinsic == 0 && u.uprops[6].extrinsic == 0) {
        if (((byte)youmonst.mintrinsics & 0x20) != 0) goto LAB_001911c0;
        uVar7 = mt_random();
        losestr((uVar7 & 3) + 1,'\0');
        uVar14 = 0xf;
        uVar7 = u.uprops[6].intrinsic;
        if ((u.uprops[6].intrinsic >> 0x1a & 1) != 0) goto LAB_00191172;
LAB_001911a4:
        uVar7 = mt_random();
        losehp((int)((ulong)uVar7 % uVar14) + 1,"poisonous corpse",0);
      }
      else {
        if ((((u.uprops[6].intrinsic >> 0x1a & 1) != 0) &&
            ((u.uprops[6].intrinsic & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0)) &&
           (uVar7 = 0, ((byte)youmonst.mintrinsics & 0x20) == 0)) {
LAB_00191172:
          uVar14 = 0xf;
          if ((uVar7 & 0xfbffffff) == 0 && u.uprops[6].extrinsic == 0) {
            uVar14 = (ulong)((uint)(((byte)youmonst.mintrinsics & 0x20) >> 5) * 8 + 7);
          }
          goto LAB_001911a4;
        }
LAB_001911c0:
        pline("You seem unaffected by the poison.");
      }
      bVar18 = false;
      exercise(4,'\0');
    }
  }
  else {
    bVar18 = false;
    pline("You have a very bad case of stomach acid.");
    uVar7 = mt_random();
    losehp(uVar7 % 0xf + 1,"acidic corpse",0);
  }
  lVar9 = (ulong)(mons[lVar17].cwt >> 6) + 3;
  victual.reqtime = (int)lVar9;
  if ((otmp->field_0x4d & 8) != 0) {
    victual.reqtime = rounddiv(lVar9,5);
  }
  if (((bVar18) && (uVar12 != 0xa3)) &&
     ((uVar12 != 0x154 &&
      (((otmp->field_0x4b & 3) != 0 || (uVar7 = mt_random(), uVar7 * -0x49249249 < 0x24924925))))))
  {
    iVar8 = rottenfood(otmp);
    if (iVar8 == 0) {
      uVar6 = mons[otmp->corpsenm].cnutrit;
      if (uVar6 == 0) {
        pline("The corpse rots away completely.");
        goto LAB_001915d4;
      }
      uVar12 = otmp->oeaten;
      otmp->oeaten = uVar12 >> 2;
      iVar8 = 0;
      if (uVar12 < 4) {
        if (victual.piece == otmp) {
          victual.reqtime = victual.usedtime;
        }
        otmp->oeaten = 1;
      }
    }
    else {
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffcff | 0x100;
      touchfood(otmp);
      uVar6 = mons[otmp->corpsenm].cnutrit;
      iVar8 = 1;
      if (uVar6 == 0) {
LAB_001915d4:
        if (otmp->where == '\x03') {
          useup(otmp);
        }
        else {
          useupf(otmp,1);
        }
        iVar8 = 2;
        goto LAB_001915fd;
      }
    }
    if (((otmp->field_0x4d & 8) != 0) &&
       (uVar12 = (uint)((ulong)uVar6 * 0xccccccd0 >> 0x20), otmp->oeaten < uVar12)) {
      otmp->oeaten = uVar12;
    }
    goto LAB_001915fd;
  }
  iVar8 = 0;
  if (((youmonst.data)->mlet == '0') ||
     (youmonst.data == mons + 0x85 || ((youmonst.data)->mflags2 & 0x100) != 0)) goto LAB_001915fd;
  if ((uVar2 & 1) == 0) {
    pcVar16 = "This ";
  }
  else {
    pcVar16 = "";
    if ((mons[lVar17].mflags2 & 0x80000) == 0) {
      pcVar16 = "The ";
    }
  }
  pcVar11 = food_xname(otmp,'\0');
  if (0x37 < uVar15) goto LAB_00191525;
  uVar14 = (ulong)uVar15;
  if ((0x40000102400404U >> (uVar14 & 0x3f) & 1) == 0) {
    if (uVar14 == 0x1f) {
      if (uVar12 == 0x9e) goto LAB_00191525;
      goto LAB_00191304;
    }
    if ((uVar14 == 0x37) && ((uVar12 | 2) != 0x106)) goto LAB_00191304;
LAB_00191525:
    uVar12 = (uint)(((youmonst.data)->mflags1 & 0x60000000) == 0x20000000);
  }
  else {
LAB_00191304:
    uVar12 = (uint)(((youmonst.data)->mflags1 >> 0x1d & 1) == 0) & (youmonst.data)->mflags1 >> 0x1e;
  }
  pcVar13 = "is delicious";
  if (uVar12 == 0) {
    pcVar13 = "tastes terrible";
  }
  iVar8 = 0;
  pline("%s%s %s!",pcVar16,pcVar11,pcVar13);
LAB_001915fd:
  if ((uVar3 & 0x80004) == 0) {
    if (bVar1 != 2) {
      return iVar8;
    }
  }
  else if ((bVar1 < 0x2e) && ((0x210000002000U >> ((ulong)uVar15 & 0x3f) & 1) != 0)) {
    return iVar8;
  }
  uVar12 = mt_random();
  if (0x33333333 < uVar12 * -0x33333333) {
    return iVar8;
  }
  if ((youmonst.data)->mlet == '0') {
    return iVar8;
  }
  if (youmonst.data == mons + 0x85 || ((youmonst.data)->mflags2 & 0x100) != 0) {
    return iVar8;
  }
  pcVar16 = "glibbery";
  if ((uVar3 & 4) == 0) {
    pcVar16 = "slimy";
  }
  pcVar11 = body_part(3);
  pcVar11 = makeplural(pcVar11);
  pcVar13 = "even more";
  if (u.uprops[0x29].intrinsic == 0) {
    pcVar13 = "very";
  }
  pline("Eating this %s corpse makes your %s %s slippery.",pcVar16,pcVar11,pcVar13);
  uVar12 = mt_random();
  incr_itimeout(&u.uprops[0x29].intrinsic,(ulong)(uVar12 % 0xf + 1));
  return iVar8;
}

Assistant:

static int eatcorpse(struct obj *otmp)
{
	int tp = 0, mnum = otmp->corpsenm;
	long rotted = 0L;
	boolean uniq = !!(mons[mnum].geno & G_UNIQ);
	int retcode = 0;
	boolean stoneable = (touch_petrifies(&mons[mnum]) && !Stone_resistance &&
				!poly_when_stoned(youmonst.data));

	/* KMH, conduct */
	/* eating a corpse breaks food-conducts here */
	if (!vegetarian(&mons[mnum])) violated(CONDUCT_VEGETARIAN);
	else if (!vegan(&mons[mnum])) violated(CONDUCT_VEGAN);
	else violated(CONDUCT_FOODLESS);

	if (mnum != PM_LIZARD && mnum != PM_LICHEN) {
		long age = peek_at_iced_corpse_age(otmp);

		rotted = (moves - age)/(10L + rn2(20));
		if (otmp->cursed) rotted += 2L;
		else if (otmp->blessed) rotted -= 2L;
	}

	/* Vampires only drink the blood of very young, meaty corpses.
	 * is_edible only allows meaty corpses here.
	 * Blood is assumed to be 1/5 of the nutrition.
	 * Thus happens before the conduct checks intentionally - should it be after?
	 * Blood is assumed to be meat and flesh.
	 */
	if (is_vampiric(youmonst.data)) {
		/* oeaten is set up by touchfood */
		if (otmp->odrained ?
		    otmp->oeaten <= drainlevel(otmp) :
		    otmp->oeaten < mons[otmp->corpsenm].cnutrit) {
			pline("There is no blood left in this corpse!");
			return 3;
		} else if (rotted <= 0 &&
			   peek_at_iced_corpse_age(otmp) + 5 >= moves) {
			char buf[BUFSZ];

			/* Generate the name for the corpse */
			if (!uniq || Hallucination)
				sprintf(buf, "%s", the(corpse_xname(otmp, TRUE)));
			else
				sprintf(buf, "%s%s corpse",
					!type_is_pname(&mons[mnum]) ? "the " : "",
					s_suffix(mons[mnum].mname));

			pline("You drain the blood from %s.", buf);
			otmp->odrained = 1;
		} else {
			pline("The blood in this corpse has coagulated!");
			return 3;
		}
	} else {
		otmp->odrained = 0;
	}

	if (mnum != PM_ACID_BLOB && !stoneable && rotted > 5L) {
		boolean cannibal = maybe_cannibal(mnum, FALSE);
		pline("Ulch!  That %s was tainted%s!",
		      mons[mnum].mlet == S_FUNGUS ? "fungoid vegetation" :
		      !vegetarian(&mons[mnum]) ? "meat" : "protoplasm",
		      cannibal ? "; you cannibal" : "");
		if (Sick_resistance) {
			pline("It doesn't seem at all sickening, though...");
		} else {
			char buf[BUFSZ];
			long sick_time;

			sick_time = (long) rn1(10, 10);
			/* make sure new ill doesn't result in improvement */
			if (Sick && (sick_time > Sick))
			    sick_time = (Sick > 1L) ? Sick - 1L : 1L;
			if (!uniq)
			    sprintf(buf, "rotted %s", corpse_xname(otmp,TRUE));
			else
			    sprintf(buf, "%s%s rotted corpse",
				    !type_is_pname(&mons[mnum]) ? "the " : "",
				    s_suffix(mons_mname(&mons[mnum])));
			make_sick(sick_time, buf, TRUE, SICK_VOMITABLE);
		}
		if (carried(otmp)) useup(otmp);
		else useupf(otmp, 1L);
		return 2;
	} else if (acidic(&mons[mnum]) && !Acid_resistance) {
		tp++;
		pline("You have a very bad case of stomach acid."); /* not body_part() */
		losehp(rnd(15), "acidic corpse", KILLED_BY_AN);
	} else if (poisonous(&mons[mnum]) && rn2(5)) {
		tp++;
		pline("Ecch - that must have been poisonous!");
		if (!FPoison_resistance) {
			if (!Poison_resistance)
			    losestr(rnd(4), FALSE);
			losehp(rnd(PPoison_resistance ? 7 : 15),
			       "poisonous corpse", KILLED_BY_AN);
		} else	pline("You seem unaffected by the poison.");
		exercise(A_CON, FALSE);
	/* now any corpse left too long will make you mildly ill */
	} else if ((rotted > 5L || (rotted > 3L && rn2(5)))
					&& !Sick_resistance) {
		tp++;
		pline("You feel %ssick.", (Sick) ? "very " : "");
		losehp(rnd(8), "cadaver", KILLED_BY_AN);
	}

	/* delay is weight dependent */
	victual.reqtime = 3 + (mons[mnum].cwt >> 6);
	if (otmp->odrained)
		victual.reqtime = rounddiv(victual.reqtime, 5);

	if (!tp && mnum != PM_LIZARD && mnum != PM_LICHEN &&
			(otmp->orotten || !rn2(7))) {
	    if (rottenfood(otmp)) {
		otmp->orotten = TRUE;
		touchfood(otmp);
		retcode = 1;
	    }

	    if (!mons[otmp->corpsenm].cnutrit) {
		/* no nutrution: rots away, no message if you passed out */
		if (!retcode) pline("The corpse rots away completely.");
		if (carried(otmp)) useup(otmp);
		else useupf(otmp, 1L);
		retcode = 2;
	    }

	    if (!retcode) consume_oeaten(otmp, 2);	/* oeaten >>= 2 */
	    if (retcode < 2 && otmp->odrained && otmp->oeaten < drainlevel(otmp))
		otmp->oeaten = drainlevel(otmp);
	} else if (!is_vampiric(youmonst.data)) {
	    pline("%s%s %s!",
		  !uniq ? "This " : !type_is_pname(&mons[mnum]) ? "The " : "",
		  food_xname(otmp, FALSE),
		  (vegan(&mons[mnum]) ?
		   (!carnivorous(youmonst.data) && herbivorous(youmonst.data)) :
		   (carnivorous(youmonst.data) && !herbivorous(youmonst.data)))
		  ? "is delicious" : "tastes terrible");
	}

	/* Eating slimy or oily corpses makes your fingers slippery.
	 * Note: Snakes are not slimy. */
	if ((amorphous(&mons[mnum]) || slithy(&mons[mnum]) ||
	     mons[mnum].mlet == S_BLOB) &&
	    mons[mnum].mlet != S_SNAKE && mons[mnum].mlet != S_NAGA &&
	    mons[mnum].mlet != S_MIMIC && rnf(1,5) &&
	    !is_vampiric(youmonst.data)) {
	    pline("Eating this %s corpse makes your %s %s slippery.",
		  amorphous(&mons[mnum]) ? "glibbery" : "slimy",
		  makeplural(body_part(FINGER)),
		  Glib ? "even more" : "very");
	    incr_itimeout(&Glib, rnd(15));
	}

	return retcode;
}